

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O3

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::maintain_invariant
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *this)

{
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  __first;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  __last;
  long lVar1;
  ulong uVar2;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::greater<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_00000008;
  
  __first._M_current = (this->m_begin)._M_current;
  __last._M_current = (this->m_end)._M_current;
  if (__first._M_current + (this->m_min_items - 1) == __last._M_current ||
      __first._M_current == __last._M_current) {
    return;
  }
  uVar2 = (long)__last._M_current - (long)__first._M_current >> 4;
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  std::
  __introselect<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<std::greater<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
            (__first,__first._M_current + (this->m_min_items - 1),__last,
             (ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,in_stack_00000008);
  return;
}

Assistant:

void maintain_invariant ()
        {
            std::nth_element(m_begin, semiintersection_candidate(), m_end, each(front) | m_compare);
        }